

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BCCLattice.cpp
# Opt level: O0

void __thiscall OpenMD::BCCLattice::update(BCCLattice *this)

{
  Vector<double,_3U> *pVVar1;
  double *pdVar2;
  long in_RDI;
  double dVar3;
  double dVar4;
  RealType oneOverRoot3;
  RealType cellLenOver2;
  
  dVar3 = *(double *)(in_RDI + 0x70) * 0.5;
  dVar4 = sqrt(3.0);
  dVar4 = 1.0 / dVar4;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x28),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,0);
  *pdVar2 = 0.0;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x28),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,1);
  *pdVar2 = 0.0;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x28),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,2);
  *pdVar2 = 0.0;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x40),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,0);
  *pdVar2 = dVar4;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x40),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,1);
  *pdVar2 = dVar4;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x40),0)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,2);
  *pdVar2 = dVar4;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x28),1)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,0);
  *pdVar2 = dVar3;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x28),1)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,1);
  *pdVar2 = dVar3;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x28),1)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,2);
  *pdVar2 = dVar3;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x40),1)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,0);
  *pdVar2 = -dVar4;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x40),1)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,1);
  *pdVar2 = -dVar4;
  pVVar1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[]((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )(in_RDI + 0x40),1)->super_Vector<double,_3U>;
  pdVar2 = Vector<double,_3U>::operator[](pVVar1,2);
  *pdVar2 = -dVar4;
  return;
}

Assistant:

void BCCLattice::update() {
    RealType cellLenOver2;
    RealType oneOverRoot3;

    cellLenOver2 = 0.5 * latticeParam;
    oneOverRoot3 = 1.0 / sqrt(3.0);

    // Molecule 1
    cellSitesPos[0][0] = 0.0;
    cellSitesPos[0][1] = 0.0;
    cellSitesPos[0][2] = 0.0;

    cellSitesOrt[0][0] = oneOverRoot3;
    cellSitesOrt[0][1] = oneOverRoot3;
    cellSitesOrt[0][2] = oneOverRoot3;

    // Molecule 2
    cellSitesPos[1][0] = cellLenOver2;
    cellSitesPos[1][1] = cellLenOver2;
    cellSitesPos[1][2] = cellLenOver2;

    cellSitesOrt[1][0] = -oneOverRoot3;
    cellSitesOrt[1][1] = -oneOverRoot3;
    cellSitesOrt[1][2] = -oneOverRoot3;
  }